

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O2

bool __thiscall tinyusdz::usdc::USDCReader::Impl::ReconstructStage(Impl *this,Stage *stage)

{
  CrateReader *pCVar1;
  pointer pSVar2;
  bool bVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  ostream *poVar6;
  char *pcVar7;
  long lVar8;
  ulong uVar9;
  PathIndexToSpecIndexMap path_index_to_spec_index_map;
  string local_1c8;
  ostringstream ss_w;
  
  pCVar1 = this->crate_reader;
  if ((pCVar1->_nodes).
      super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (pCVar1->_nodes).
      super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_w);
    poVar6 = ::std::operator<<((ostream *)&ss_w,"[warn]");
    poVar6 = ::std::operator<<(poVar6,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                              );
    poVar6 = ::std::operator<<(poVar6,":");
    poVar6 = ::std::operator<<(poVar6,"ReconstructStage");
    poVar6 = ::std::operator<<(poVar6,"():");
    poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0xd9a);
    ::std::operator<<(poVar6," ");
    poVar6 = ::std::operator<<((ostream *)&ss_w,"Empty scene.");
    ::std::operator<<(poVar6,"\n");
    ::std::__cxx11::stringbuf::str();
    PushWarn(this,(string *)&path_index_to_spec_index_map);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_w);
    bVar3 = true;
  }
  else {
    ::std::
    vector<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
    ::vector((vector<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
              *)&ss_w,&pCVar1->_nodes);
    ::std::
    vector<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
    ::operator=(&this->_nodes,
                (vector<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                 *)&ss_w);
    ::std::
    vector<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
    ::~vector((vector<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
               *)&ss_w);
    ::std::vector<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>::operator=
              (&this->_specs,&this->crate_reader->_specs);
    ::std::vector<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_>::operator=
              (&this->_fields,&this->crate_reader->_fields);
    ::std::vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>::operator=
              (&this->_fieldset_indices,&this->crate_reader->_fieldset_indices);
    std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&this->_paths,
               (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
               &this->crate_reader->_paths);
    std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&this->_elemPaths,
               (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
               &this->crate_reader->_elemPaths);
    ::std::
    _Rb_tree<tinyusdz::crate::Index,_std::pair<const_tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>_>,_std::_Select1st<std::pair<const_tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>_>_>,_std::less<tinyusdz::crate::Index>,_std::allocator<std::pair<const_tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>_>_>_>
    ::operator=(&(this->_live_fieldsets)._M_t,&(this->crate_reader->_live_fieldsets)._M_t);
    path_index_to_spec_index_map._M_h._M_buckets =
         &path_index_to_spec_index_map._M_h._M_single_bucket;
    path_index_to_spec_index_map._M_h._M_bucket_count = 1;
    path_index_to_spec_index_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    path_index_to_spec_index_map._M_h._M_element_count = 0;
    path_index_to_spec_index_map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    path_index_to_spec_index_map._M_h._M_rehash_policy._M_next_resize = 0;
    path_index_to_spec_index_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
    lVar8 = 0;
    for (uVar9 = 0;
        pSVar2 = (this->_specs).
                 super__Vector_base<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>.
                 _M_impl.super__Vector_impl_data._M_start,
        uVar9 < (ulong)(((long)(this->_specs).
                               super__Vector_base<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2) / 0xc);
        uVar9 = uVar9 + 1) {
      if (*(int *)((long)&(pSVar2->path_index).value + lVar8) != -1) {
        sVar4 = ::std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::count(&path_index_to_spec_index_map._M_h,
                        (key_type_conflict1 *)((long)&(pSVar2->path_index).value + lVar8));
        if (sVar4 != 0) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_w);
          poVar6 = ::std::operator<<((ostream *)&ss_w,"[error]");
          poVar6 = ::std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar6 = ::std::operator<<(poVar6,":");
          poVar6 = ::std::operator<<(poVar6,"ReconstructStage");
          poVar6 = ::std::operator<<(poVar6,"():");
          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0xdb2);
          ::std::operator<<(poVar6," ");
          pcVar7 = "Multiple PathIndex found in Crate data.";
          goto LAB_001643f8;
        }
        pmVar5 = ::std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&path_index_to_spec_index_map._M_h,
                              (key_type *)
                              ((long)&(((this->_specs).
                                        super__Vector_base<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->path_index).
                                      value + lVar8));
        *pmVar5 = (mapped_type)uVar9;
      }
      lVar8 = lVar8 + 0xc;
    }
    ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::clear(&stage->_root_nodes);
    bVar3 = ReconstructPrimRecursively(this,-1,0,(Prim *)0x0,0,&path_index_to_spec_index_map,stage);
    if (bVar3) {
      Stage::compute_absolute_prim_path_and_assign_prim_id(stage,true);
      bVar3 = true;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_w);
      poVar6 = ::std::operator<<((ostream *)&ss_w,"[error]");
      poVar6 = ::std::operator<<(poVar6,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                );
      poVar6 = ::std::operator<<(poVar6,":");
      poVar6 = ::std::operator<<(poVar6,"ReconstructStage");
      poVar6 = ::std::operator<<(poVar6,"():");
      poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0xdc4);
      ::std::operator<<(poVar6," ");
      pcVar7 = "Failed to reconstruct Stage(Prim hierarchy)";
LAB_001643f8:
      poVar6 = ::std::operator<<((ostream *)&ss_w,pcVar7);
      ::std::operator<<(poVar6,"\n");
      ::std::__cxx11::stringbuf::str();
      PushError(this,&local_1c8);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_w);
      bVar3 = false;
    }
    ::std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&path_index_to_spec_index_map._M_h);
  }
  return bVar3;
}

Assistant:

bool USDCReader::Impl::ReconstructStage(Stage *stage) {

  // format test
  DCOUT(fmt::format("# of Paths = {}", crate_reader->NumPaths()));

  if (crate_reader->NumNodes() == 0) {
    PUSH_WARN("Empty scene.");
    return true;
  }

  // TODO: Directly access data in crate_reader.
  _nodes = crate_reader->GetNodes();
  _specs = crate_reader->GetSpecs();
  _fields = crate_reader->GetFields();
  _fieldset_indices = crate_reader->GetFieldsetIndices();
  _paths = crate_reader->GetPaths();
  _elemPaths = crate_reader->GetElemPaths();
  _live_fieldsets = crate_reader->GetLiveFieldSets();

  PathIndexToSpecIndexMap
      path_index_to_spec_index_map;  // path_index -> spec_index

  {
    for (size_t i = 0; i < _specs.size(); i++) {
      if (_specs[i].path_index.value == ~0u) {
        continue;
      }

      // path_index should be unique.
      if (path_index_to_spec_index_map.count(_specs[i].path_index.value) != 0) {
        PUSH_ERROR_AND_RETURN("Multiple PathIndex found in Crate data.");
      }

      DCOUT(fmt::format("path index[{}] -> spec index [{}]",
                        _specs[i].path_index.value, uint32_t(i)));
      path_index_to_spec_index_map[_specs[i].path_index.value] = uint32_t(i);
    }
  }

  stage->root_prims().clear();

  int root_node_id = 0;
  bool ret = ReconstructPrimRecursively(/* no further root for root_node */ -1,
                                        root_node_id, /* root Prim */ nullptr,
                                        /* level */ 0,
                                        path_index_to_spec_index_map, stage);

  if (!ret) {
    PUSH_ERROR_AND_RETURN("Failed to reconstruct Stage(Prim hierarchy)");
  }

  stage->compute_absolute_prim_path_and_assign_prim_id();

  return true;
}